

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

void ma_copy_and_apply_volume_and_clip_samples_s24
               (ma_uint8 *pDst,ma_int64 *pSrc,ma_uint64 count,float volume)

{
  ma_uint64 mVar1;
  long lVar2;
  ma_uint8 *pmVar3;
  
  if (pDst == (ma_uint8 *)0x0) {
    __assert_fail("pDst != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x76e6,
                  "void ma_copy_and_apply_volume_and_clip_samples_s24(ma_uint8 *, const ma_int64 *, ma_uint64, float)"
                 );
  }
  if (pSrc != (ma_int64 *)0x0) {
    if (count != 0) {
      pmVar3 = pDst + 2;
      mVar1 = 0;
      do {
        lVar2 = pSrc[mVar1] * (long)(short)(int)(volume * 256.0) >> 8;
        if (0x7ffffe < lVar2) {
          lVar2 = 0x7fffff;
        }
        if (lVar2 < -0x7fffff) {
          lVar2 = -0x800000;
        }
        pmVar3[-2] = (ma_uint8)lVar2;
        pmVar3[-1] = (ma_uint8)((ulong)lVar2 >> 8);
        *pmVar3 = (ma_uint8)((ulong)lVar2 >> 0x10);
        mVar1 = mVar1 + 1;
        pmVar3 = pmVar3 + 3;
      } while (count != mVar1);
    }
    return;
  }
  __assert_fail("pSrc != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x76e7,
                "void ma_copy_and_apply_volume_and_clip_samples_s24(ma_uint8 *, const ma_int64 *, ma_uint64, float)"
               );
}

Assistant:

MA_API void ma_copy_and_apply_volume_and_clip_samples_s24(ma_uint8* pDst, const ma_int64* pSrc, ma_uint64 count, float volume)
{
    ma_uint64 iSample;
    ma_int16  volumeFixed;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    volumeFixed = ma_float_to_fixed_16(volume);

    for (iSample = 0; iSample < count; iSample += 1) {
        ma_int64 s = ma_clip_s24(ma_apply_volume_unclipped_s24(pSrc[iSample], volumeFixed));
        pDst[iSample*3 + 0] = (ma_uint8)((s & 0x000000FF) >>  0);
        pDst[iSample*3 + 1] = (ma_uint8)((s & 0x0000FF00) >>  8);
        pDst[iSample*3 + 2] = (ma_uint8)((s & 0x00FF0000) >> 16);
    }
}